

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

int __thiscall QUtcTimeZonePrivate::init(QUtcTimeZonePrivate *this,EVP_PKEY_CTX *ctx)

{
  QString *pQVar1;
  QString *in_RCX;
  int in_EDX;
  QString *in_R8;
  Territory in_R9W;
  QString *in_stack_00000008;
  
  QByteArray::operator=(&(this->super_QTimeZonePrivate).m_id,(QByteArray *)ctx);
  this->m_offsetFromUtc = in_EDX;
  QString::operator=(&this->m_name,in_RCX);
  QString::operator=(&this->m_abbreviation,in_R8);
  this->m_territory = in_R9W;
  pQVar1 = QString::operator=(&this->m_comment,in_stack_00000008);
  return (int)pQVar1;
}

Assistant:

void QUtcTimeZonePrivate::init(const QByteArray &zoneId, int offsetSeconds, const QString &name,
                               const QString &abbreviation, QLocale::Territory territory,
                               const QString &comment)
{
    m_id = zoneId;
    m_offsetFromUtc = offsetSeconds;
    m_name = name;
    m_abbreviation = abbreviation;
    m_territory = territory;
    m_comment = comment;
}